

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O1

void __thiscall DRAG<RemSP>::FirstScan(DRAG<RemSP> *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  uVar12 = (ulong)iVar2;
  iVar3 = *(int *)&pMVar4->field_0xc;
  lVar19 = (long)iVar3;
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  if (0 < (long)uVar12) {
    uVar10 = 0;
    do {
      if (0 < iVar3) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar13 = **(long **)&pMVar4->field_0x48;
        lVar9 = lVar13 * uVar10 + *(long *)&pMVar4->field_0x10;
        lVar17 = lVar9 - lVar13;
        lVar7 = lVar17 - lVar13;
        lVar13 = lVar13 + lVar9;
        lVar14 = **(long **)&pMVar5->field_0x48;
        lVar16 = lVar14 * uVar10 + *(long *)&pMVar5->field_0x10;
        lVar14 = lVar16 + lVar14 * -2;
        uVar15 = uVar10 | 1;
        uVar18 = 0;
        do {
          if (*(char *)(lVar9 + uVar18) == '\0') {
            if ((uVar15 < uVar12) && (*(char *)(lVar13 + uVar18) != '\0')) {
              uVar8 = uVar18 | 1;
              if (((long)uVar8 < lVar19) && (*(char *)(lVar9 + uVar8) != '\0')) {
                if (uVar18 == 0) {
LAB_0011e633:
                  if (((uVar10 == 0) || (lVar19 <= (long)(uVar18 | 1))) ||
                     (*(char *)(lVar17 + (uVar18 | 1)) == '\0')) {
                    if (((uVar10 != 0) && ((long)(uVar18 + 2) < lVar19)) &&
                       (*(char *)(lVar17 + uVar18 + 2) != '\0')) {
                      if (*(char *)(lVar17 + uVar18) == '\0') goto LAB_0011e9e4;
                      goto LAB_0011e7fa;
                    }
                    if ((uVar10 == 0) || (*(char *)(lVar17 + uVar18) == '\0')) goto LAB_0011e8a1;
                  }
                  goto LAB_0011e831;
                }
                if (*(char *)((uVar18 - 1) + lVar9) != '\0') {
                  if ((uVar10 == 0) || (*(char *)(lVar17 + uVar8) == '\0')) goto LAB_0011e696;
                  goto LAB_0011e581;
                }
                if (*(char *)(lVar13 + -1 + uVar18) == '\0') goto LAB_0011e633;
                if ((uVar10 == 0) || (*(char *)(lVar17 + uVar8) == '\0')) {
                  if (((uVar10 == 0) || (lVar19 <= (long)(uVar18 + 2))) ||
                     (*(char *)(lVar17 + uVar18 + 2) == '\0')) {
                    if ((uVar10 == 0) || (*(char *)(lVar17 + uVar18) == '\0')) goto LAB_0011eaa5;
                    cVar1 = *(char *)((uVar18 - 2) + lVar9);
                    goto joined_r0x0011ea9d;
                  }
                  if (*(char *)(lVar7 + uVar8) == '\0') {
                    if (*(char *)(lVar17 + uVar18) != '\0') {
                      if (*(char *)((uVar18 - 2) + lVar9) == '\0') goto LAB_0011ebb3;
                      if (*(char *)(lVar17 + -1 + uVar18) == '\0') goto LAB_0011eb7f;
                      goto LAB_0011e9da;
                    }
                    goto LAB_0011e6d3;
                  }
                }
                if (*(char *)((uVar18 - 2) + lVar9) != '\0') {
LAB_0011e723:
                  if ((uVar18 != 0 && uVar10 != 0) && (*(char *)(lVar17 + -1 + uVar18) != '\0')) {
LAB_0011e910:
                    if (uVar10 != 0) {
                      if (*(char *)(lVar17 + uVar18) != '\0') goto LAB_0011e852;
                      goto LAB_0011e7af;
                    }
                    goto LAB_0011e955;
                  }
LAB_0011e73f:
                  if ((uVar18 != 0 && uVar10 != 0) && (*(char *)(lVar17 + -2 + uVar18) != '\0')) {
                    if (*(char *)(lVar7 + -1 + uVar18) != '\0') goto LAB_0011e910;
                    goto LAB_0011e955;
                  }
                }
LAB_0011ea66:
                uVar6 = *(uint *)(lVar14 + uVar18 * 4);
LAB_0011ea6a:
                uVar11 = *(uint *)(lVar16 + -8 + uVar18 * 4);
                goto LAB_0011ea6f;
              }
              if ((uVar18 != 0) &&
                 ((*(char *)((uVar18 - 1) + lVar13) != '\0' ||
                  (*(char *)(lVar9 + -1 + uVar18) != '\0')))) goto LAB_0011eaa5;
LAB_0011e8a1:
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar6 = RemSP::length_ + 1;
              *(uint *)(lVar16 + uVar18 * 4) = RemSP::length_;
              RemSP::length_ = uVar6;
            }
            else {
              uVar8 = uVar18 | 1;
              if ((long)uVar8 < lVar19) {
                if (*(char *)(lVar9 + uVar8) != '\0') goto LAB_0011e633;
                if ((uVar15 < uVar12) && (*(char *)(lVar13 + uVar8) != '\0')) goto LAB_0011e8a1;
              }
              *(undefined4 *)(lVar16 + uVar18 * 4) = 0;
            }
          }
          else {
            if (uVar18 == 0) {
LAB_0011e775:
              uVar8 = uVar18 | 1;
              if ((uVar10 == 0) || ((lVar19 <= (long)uVar8 || (*(char *)(lVar17 + uVar8) == '\0'))))
              {
                if (((long)uVar8 < lVar19) &&
                   ((((*(char *)(lVar9 + uVar8) != '\0' && (uVar10 != 0)) &&
                     ((long)(uVar18 + 2) < lVar19)) && (*(char *)(lVar17 + uVar18 + 2) != '\0')))) {
                  if (*(char *)(lVar17 + uVar18) == '\0') {
                    if ((uVar18 == 0) || (*(char *)(lVar17 + -1 + uVar18) == '\0')) {
LAB_0011e9e4:
                      uVar6 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                      goto LAB_0011eaaa;
                    }
                    if (*(char *)(lVar7 + uVar8) == '\0') goto LAB_0011e9da;
                    goto LAB_0011e7af;
                  }
LAB_0011e7fa:
                  if (((uVar10 == 0) || (lVar19 <= (long)(uVar18 | 1))) ||
                     (*(char *)(lVar7 + (uVar18 | 1)) == '\0')) {
                    uVar6 = *(uint *)(lVar14 + uVar18 * 4);
LAB_0011e81a:
                    uVar11 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                    goto LAB_0011ea6f;
                  }
                }
                else if ((uVar10 == 0) || (*(char *)(lVar17 + uVar18) == '\0')) {
                  if ((uVar10 == 0 || uVar18 == 0) || (*(char *)(lVar17 + -1 + uVar18) == '\0'))
                  goto LAB_0011e8a1;
                  goto LAB_0011e852;
                }
              }
              else if (((*(char *)(lVar17 + uVar18) == '\0') && (uVar18 != 0)) &&
                      (*(char *)(lVar17 + -1 + uVar18) != '\0')) {
LAB_0011e7af:
                if ((uVar10 != 0) && (*(char *)(lVar7 + uVar18) != '\0')) goto LAB_0011e852;
LAB_0011e955:
                uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                uVar11 = *(uint *)(lVar14 + uVar18 * 4);
                goto LAB_0011ea6f;
              }
LAB_0011e831:
              uVar6 = *(uint *)(lVar14 + uVar18 * 4);
            }
            else if (*(char *)(lVar9 + -1 + uVar18) == '\0') {
              if ((uVar12 <= uVar15) || (*(char *)(lVar13 + -1 + uVar18) == '\0'))
              goto LAB_0011e775;
              uVar8 = uVar18 | 1;
              if (((uVar10 != 0) && ((long)uVar8 < lVar19)) && (*(char *)(lVar17 + uVar8) != '\0'))
              {
                if (*(char *)((uVar18 - 2) + lVar9) != '\0') goto LAB_0011e723;
                if ((*(char *)(lVar17 + uVar18) == '\0') &&
                   (*(char *)(lVar17 + -1 + uVar18) != '\0')) {
LAB_0011eac8:
                  if ((uVar10 == 0) || (*(char *)(lVar7 + uVar18) == '\0')) {
                    uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                    uVar11 = *(uint *)(lVar14 + uVar18 * 4);
LAB_0011eb17:
                    uVar6 = RemSP::Merge(uVar6,uVar11);
                    uVar11 = *(uint *)(lVar16 + -8 + uVar18 * 4);
                  }
                  else {
                    uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
LAB_0011ea3a:
                    uVar11 = *(uint *)(lVar16 + -8 + uVar18 * 4);
                  }
LAB_0011ea3f:
                  uVar6 = RemSP::Merge(uVar6,uVar11);
                  *(uint *)(lVar16 + uVar18 * 4) = uVar6;
                  goto LAB_0011eaae;
                }
                goto LAB_0011ea66;
              }
              if (((lVar19 <= (long)uVar8) || (*(char *)(lVar9 + uVar8) == '\0')) ||
                 ((uVar10 == 0 ||
                  ((lVar19 <= (long)(uVar18 + 2) || (*(char *)(lVar17 + uVar18 + 2) == '\0')))))) {
                if (uVar10 == 0) goto LAB_0011eaa5;
                if (*(char *)(lVar17 + -1 + uVar18) == '\0') {
                  if (*(char *)(lVar17 + uVar18) == '\0') goto LAB_0011eaa5;
                  if (*(char *)((uVar18 - 2) + lVar9) == '\0') goto LAB_0011ea66;
                  goto LAB_0011ea02;
                }
                uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                if (*(char *)(lVar9 + -2 + uVar18) != '\0') {
                  *(uint *)(lVar16 + uVar18 * 4) = uVar6;
                  goto LAB_0011eaae;
                }
                goto LAB_0011ea6a;
              }
              if (*(char *)((uVar18 - 2) + lVar9) != '\0') {
                if (*(char *)(lVar17 + -1 + uVar18) == '\0') {
                  if (*(char *)(lVar7 + uVar8) == '\0') {
                    if (*(char *)(lVar17 + uVar18) != '\0') {
LAB_0011eb7f:
                      if ((uVar18 == 0 || uVar10 == 0) || (*(char *)(lVar17 + -2 + uVar18) == '\0'))
                      {
LAB_0011ebb3:
                        uVar6 = *(uint *)(lVar14 + uVar18 * 4);
                        goto LAB_0011ebb7;
                      }
                      if (*(char *)(lVar7 + -1 + uVar18) == '\0') {
                        uVar6 = *(uint *)(lVar14 + uVar18 * 4);
                        goto LAB_0011eb07;
                      }
                      uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                      uVar11 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                      goto LAB_0011ea3f;
                    }
                    goto LAB_0011e6d3;
                  }
                  goto LAB_0011e73f;
                }
                if (*(char *)(lVar7 + uVar8) != '\0') goto LAB_0011e910;
LAB_0011e9da:
                uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                goto LAB_0011e81a;
              }
              if (*(char *)(lVar17 + uVar18) != '\0') {
                uVar6 = *(uint *)(lVar14 + uVar18 * 4);
                if (*(char *)(lVar7 + uVar8) == '\0') {
LAB_0011eb07:
                  uVar11 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                  goto LAB_0011eb17;
                }
                goto LAB_0011ea3a;
              }
              if (*(char *)(lVar17 + -1 + uVar18) == '\0') {
LAB_0011e6d3:
                uVar6 = *(uint *)(lVar14 + 8 + uVar18 * 4);
                goto LAB_0011ea6a;
              }
              if (*(char *)(lVar7 + uVar8) != '\0') goto LAB_0011eac8;
              uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
LAB_0011ebb7:
              uVar6 = RemSP::Merge(uVar6,*(uint *)(lVar14 + 8 + uVar18 * 4));
              uVar11 = *(uint *)(lVar16 + -8 + uVar18 * 4);
LAB_0011ea6f:
              uVar6 = RemSP::Merge(uVar6,uVar11);
            }
            else {
              uVar8 = uVar18 | 1;
              if (((uVar10 == 0) || (lVar19 <= (long)uVar8)) || (*(char *)(lVar17 + uVar8) == '\0'))
              {
                if (((long)uVar8 < lVar19) && (*(char *)(lVar9 + uVar8) != '\0')) {
LAB_0011e696:
                  if ((uVar10 != 0) &&
                     (((long)(uVar18 + 2) < lVar19 && (*(char *)(lVar17 + uVar18 + 2) != '\0')))) {
                    if ((lVar19 <= (long)(uVar18 | 1)) || (*(char *)(lVar7 + (uVar18 | 1)) == '\0'))
                    goto LAB_0011e6d3;
                    goto LAB_0011e581;
                  }
                }
LAB_0011eaa5:
                uVar6 = *(uint *)(lVar16 + -8 + uVar18 * 4);
              }
              else {
LAB_0011e581:
                if (uVar10 == 0) goto LAB_0011ea66;
                if (*(char *)(lVar17 + uVar18) != '\0') goto LAB_0011e831;
                cVar1 = *(char *)(lVar7 + uVar18);
joined_r0x0011ea9d:
                if (cVar1 == '\0') goto LAB_0011ea66;
                if ((uVar18 == 0 || uVar10 == 0) || (*(char *)(lVar17 + -1 + uVar18) == '\0')) {
LAB_0011ea02:
                  if ((uVar18 == 0 || uVar10 == 0) || (*(char *)(lVar17 + -2 + uVar18) == '\0')) {
                    uVar6 = *(uint *)(lVar14 + uVar18 * 4);
                    goto LAB_0011ea3a;
                  }
                  uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
                  if (*(char *)(lVar7 + -1 + uVar18) == '\0') {
                    uVar11 = *(uint *)(lVar14 + uVar18 * 4);
                    goto LAB_0011ea3f;
                  }
                  *(uint *)(lVar16 + uVar18 * 4) = uVar6;
                  goto LAB_0011eaae;
                }
LAB_0011e852:
                uVar6 = *(uint *)(lVar14 + -8 + uVar18 * 4);
              }
            }
LAB_0011eaaa:
            *(uint *)(lVar16 + uVar18 * 4) = uVar6;
          }
LAB_0011eaae:
          uVar18 = uVar18 + 2;
        } while ((long)uVar18 < lVar19);
      }
      uVar10 = uVar10 + 2;
    } while ((int)uVar10 < iVar2);
  }
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }